

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

bool32 __thiscall rw::Geometry::hasColoredMaterial(Geometry *this)

{
  uint uVar1;
  Material *pMVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (this->matList).numMaterials;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while (((uVar5 = uVar3, uVar4 != uVar5 &&
          (pMVar2 = (this->matList).materials[uVar5], (pMVar2->color).red == 0xff)) &&
         ((pMVar2->color).green == 0xff))) {
    if (((pMVar2->color).blue != 0xff) || (uVar3 = uVar5 + 1, (pMVar2->color).alpha != 0xff)) break;
  }
  return (bool32)((long)uVar5 < (long)(int)uVar1);
}

Assistant:

bool32
Geometry::hasColoredMaterial(void)
{
	for(int32 i = 0; i < this->matList.numMaterials; i++)
		if(this->matList.materials[i]->color.red != 255 ||
		   this->matList.materials[i]->color.green != 255 ||
		   this->matList.materials[i]->color.blue != 255 ||
		   this->matList.materials[i]->color.alpha != 255)
			return 1;
	return 0;
}